

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O0

void __thiscall Storage::Disk::PCMTrack::PCMTrack(PCMTrack *this,PCMSegment *segment)

{
  size_type sVar1;
  undefined1 local_70 [8];
  PCMSegment length_adjusted_segment;
  PCMSegment *segment_local;
  PCMTrack *this_local;
  
  length_adjusted_segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)segment;
  PCMTrack(this);
  PCMSegment::PCMSegment
            ((PCMSegment *)local_70,
             (PCMSegment *)
             length_adjusted_segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage);
  local_70._0_4_ = 1;
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)
                     (length_adjusted_segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_end_of_storage + 1));
  local_70._4_4_ = (undefined4)sVar1;
  std::
  vector<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
  ::emplace_back<Storage::Disk::PCMSegment>(&this->segment_event_sources_,(PCMSegment *)local_70);
  PCMSegment::~PCMSegment((PCMSegment *)local_70);
  return;
}

Assistant:

PCMTrack::PCMTrack(const PCMSegment &segment) : PCMTrack() {
	// a single segment necessarily fills the track
	PCMSegment length_adjusted_segment = segment;
	length_adjusted_segment.length_of_a_bit.length = 1;
	length_adjusted_segment.length_of_a_bit.clock_rate = unsigned(segment.data.size());
	segment_event_sources_.emplace_back(std::move(length_adjusted_segment));
}